

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

bool __thiscall
bloaty::pe::PEObjectFile::GetDisassemblyInfo
          (PEObjectFile *this,string_view param_1,DataSource param_2,DisassemblyInfo *param_3)

{
  undefined4 in_register_0000000c;
  string_view format;
  string local_28;
  
  format._M_str._4_4_ = in_register_0000000c;
  format._M_str._0_4_ = param_2;
  if (0 < verbose_level) {
    format._M_len = (size_t)"PE files do not support disassembly yet";
    absl::Substitute_abi_cxx11_(&local_28,(absl *)0x27,format);
    printf("WARNING: %s\n",local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return false;
}

Assistant:

bool GetDisassemblyInfo(string_view /*symbol*/, DataSource /*symbol_source*/,
                          DisassemblyInfo* /*info*/) const override {
    WARN("PE files do not support disassembly yet");
    return false;
  }